

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Vrc6_Apu.cpp
# Opt level: O1

void __thiscall Nes_Vrc6_Apu::Nes_Vrc6_Apu(Nes_Vrc6_Apu *this)

{
  uint8_t *puVar1;
  undefined1 auVar2 [16];
  long lVar3;
  undefined1 auVar4 [16];
  long lVar5;
  
  Blip_Synth_::Blip_Synth_(&(this->saw_synth).impl,(this->saw_synth).impulses,8);
  Blip_Synth_::Blip_Synth_(&(this->square_synth).impl,(this->square_synth).impulses,0xc);
  auVar2 = _DAT_005d8eb0;
  lVar3 = 0;
  auVar4 = _DAT_00632e10;
  do {
    if (SUB164(auVar4 ^ auVar2,4) == -0x80000000 && SUB164(auVar4 ^ auVar2,0) < -0x7ffffffd) {
      *(undefined8 *)(this->oscs[0].regs + lVar3 + 8) = 0;
      *(undefined8 *)(this->oscs[1].regs + lVar3 + 8) = 0;
    }
    lVar5 = auVar4._8_8_;
    auVar4._0_8_ = auVar4._0_8_ + 2;
    auVar4._8_8_ = lVar5 + 2;
    lVar3 = lVar3 + 0x40;
  } while (lVar3 != 0x80);
  Blip_Synth_::volume_unit(&(this->saw_synth).impl,0.006238709677419354);
  Blip_Synth_::volume_unit(&(this->square_synth).impl,0.0064466666666666665);
  this->last_time = 0;
  lVar3 = 0x10;
  do {
    this->oscs[0].regs[lVar3 + -0xe] = '\0';
    puVar1 = this->oscs[0].regs + lVar3 + -0x10;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1 = this->oscs[0].regs + lVar3;
    *(undefined8 *)puVar1 = 0;
    *(Blip_Buffer **)(puVar1 + 8) = (Blip_Buffer *)0x1;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x70);
  return;
}

Assistant:

Nes_Vrc6_Apu::Nes_Vrc6_Apu()
{
	output( NULL );
	volume( 1.0 );
	reset();
}